

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_70c7b9::HandleGetCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  bool bVar2;
  ulong val;
  long lVar3;
  uint val_00;
  pointer pbVar4;
  string *name;
  ulong uVar5;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view value_00;
  string_view value_01;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  int local_198;
  uint local_18c;
  char *local_188;
  size_t local_180;
  char local_178;
  undefined7 uStack_177;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  size_t local_140;
  char *pcStack_138;
  undefined8 local_130;
  char *local_128;
  pointer local_120;
  char *pcStack_118;
  undefined8 local_110;
  char *local_108;
  size_t local_100;
  char *pcStack_f8;
  undefined8 local_f0;
  char *local_e8;
  string local_e0;
  undefined1 local_c0 [48];
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((ulong)((long)pbVar1 - (long)pbVar4) < 0x80) {
    local_150._M_len = (size_t)&local_140;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_150,"sub-command GET requires at least three arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((size_t *)local_150._M_len != &local_140) {
      operator_delete((void *)local_150._M_len,local_140 + 1);
    }
    bVar2 = false;
  }
  else {
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar2 = GetList(&local_168,pbVar4 + 1,status->Makefile);
    name = pbVar1 + -1;
    if (bVar2) {
      if (local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_150._M_len = (size_t)&local_140;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,"GET given empty list","");
        std::__cxx11::string::_M_assign((string *)&status->Error);
        if ((size_t *)local_150._M_len != &local_140) {
          operator_delete((void *)local_150._M_len,local_140 + 1);
        }
        bVar2 = false;
      }
      else {
        local_188 = &local_178;
        local_180 = 0;
        local_178 = '\0';
        pbVar4 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (2 < ((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) - 1U) {
          val = (long)local_168.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_168.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
          uVar5 = 2;
          lVar3 = 0x40;
          do {
            bVar2 = GetIndexArg((string *)((long)&(pbVar4->_M_dataplus)._M_p + lVar3),
                                (int *)&local_18c,status->Makefile);
            if (!bVar2) {
              pbVar4 = (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pcStack_138 = *(char **)((long)&(pbVar4->_M_dataplus)._M_p + lVar3);
              local_140 = *(size_t *)((long)&pbVar4->_M_string_length + lVar3);
              local_150._M_len = 7;
              local_150._M_str = "index: ";
              local_130 = 0x15;
              local_128 = " is not a valid index";
              views_00._M_len = 3;
              views_00._M_array = &local_150;
              cmCatViews_abi_cxx11_((string *)local_c0,views_00);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
LAB_002185d1:
                operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
              }
LAB_002185d9:
              bVar2 = false;
              goto LAB_002185db;
            }
            std::__cxx11::string::append((char *)&local_188);
            val_00 = local_18c;
            if ((int)local_18c < 0) {
              local_198 = (int)val;
              val_00 = local_18c + local_198;
              if (-1 < (int)val_00) goto LAB_002183df;
LAB_0021844a:
              cmAlphaNum::cmAlphaNum(&local_90,val_00);
              local_150._M_len = 7;
              local_150._M_str = "index: ";
              local_140 = local_90.View_._M_len;
              pcStack_138 = local_90.View_._M_str;
              local_130 = 0x10;
              local_128 = " out of range (-";
              cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_c0,val);
              local_120 = (pointer)local_c0._0_8_;
              pcStack_118 = (char *)local_c0._8_8_;
              local_110 = 2;
              local_108 = ", ";
              cmAlphaNum::cmAlphaNum(&local_60,val - 1);
              local_100 = local_60.View_._M_len;
              pcStack_f8 = local_60.View_._M_str;
              local_f0 = 1;
              local_e8 = ")";
              views._M_len = 7;
              views._M_array = &local_150;
              cmCatViews_abi_cxx11_(&local_e0,views);
              std::__cxx11::string::_M_assign((string *)&status->Error);
              local_c0._16_8_ = local_e0.field_2._M_allocated_capacity;
              local_c0._0_8_ = local_e0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0._M_dataplus._M_p != &local_e0.field_2) goto LAB_002185d1;
              goto LAB_002185d9;
            }
LAB_002183df:
            if (val <= val_00) goto LAB_0021844a;
            std::__cxx11::string::_M_append
                      ((char *)&local_188,
                       (ulong)local_168.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[val_00]._M_dataplus._M_p);
            uVar5 = uVar5 + 1;
            pbVar4 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar3 = lVar3 + 0x20;
          } while (uVar5 < ((long)(args->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) -
                           1U);
        }
        bVar2 = true;
        value_01._M_str = local_188;
        value_01._M_len = local_180;
        cmMakefile::AddDefinition(status->Makefile,name,value_01);
LAB_002185db:
        if (local_188 != &local_178) {
          operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
        }
      }
    }
    else {
      bVar2 = true;
      value_00._M_str = "NOTFOUND";
      value_00._M_len = 8;
      cmMakefile::AddDefinition(status->Makefile,name,value_00);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_168);
  }
  return bVar2;
}

Assistant:

bool HandleGetCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  static std::map<cm::string_view,
                  std::function<cmCMakePath(const cmCMakePath&, bool)>> const
    actions{ { "ROOT_NAME"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRootName();
               } },
             { "ROOT_DIRECTORY"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRootDirectory();
               } },
             { "ROOT_PATH"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRootPath();
               } },
             { "FILENAME"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetFileName();
               } },
             { "EXTENSION"_s,
               [](const cmCMakePath& path, bool last_only) -> cmCMakePath {
                 if (last_only) {
                   return path.GetExtension();
                 }
                 return path.GetWideExtension();
               } },
             { "STEM"_s,
               [](const cmCMakePath& path, bool last_only) -> cmCMakePath {
                 if (last_only) {
                   return path.GetStem();
                 }
                 return path.GetNarrowStem();
               } },
             { "RELATIVE_PART"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetRelativePath();
               } },
             { "PARENT_PATH"_s,
               [](const cmCMakePath& path, bool) -> cmCMakePath {
                 return path.GetParentPath();
               } } };

  if (args.size() < 4) {
    status.SetError("GET must be called with at least three arguments.");
    return false;
  }

  const auto& action = args[2];

  if (actions.find(action) == actions.end()) {
    status.SetError(
      cmStrCat("GET called with an unknown action: ", action, "."));
    return false;
  }

  struct Arguments
  {
    bool LastOnly = false;
  };

  CMakePathArgumentParser<Arguments> parser;
  if ((action == "EXTENSION"_s || action == "STEM"_s)) {
    parser.Bind("LAST_ONLY"_s, &Arguments::LastOnly);
  }

  Arguments const arguments = parser.Parse<3>(args);

  if (parser.GetInputs().size() != 1) {
    status.SetError("GET called with unexpected arguments.");
    return false;
  }
  if (parser.GetInputs().front().empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  std::string path;
  if (!getInputPath(args[1], status, path)) {
    return false;
  }

  auto result = actions.at(action)(path, arguments.LastOnly);

  status.GetMakefile().AddDefinition(parser.GetInputs().front(),
                                     result.String());

  return true;
}